

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

word If_Dec6DeriveDisjoint(word t,int *Pla2Var,int *Var2Pla)

{
  int iVar1;
  ulong local_38;
  word z;
  uint local_28;
  int Cof1;
  int Cof0;
  int i;
  int *Var2Pla_local;
  int *Pla2Var_local;
  word t_local;
  
  _Cof0 = Var2Pla;
  Var2Pla_local = Pla2Var;
  Pla2Var_local = (int *)t;
  iVar1 = If_Dec6DeriveCount2(t,(int *)&local_28,(int *)((long)&z + 4));
  local_38 = (ulong)iVar1;
  for (Cof1 = 0; Cof1 < 4; Cof1 = Cof1 + 1) {
    local_38 = (long)Var2Pla_local[Cof1 + 2] << ((char)(Cof1 << 2) + 0x10U & 0x3f) | local_38;
  }
  local_38 = (long)(int)(z._4_4_ << 4 | local_28) << 0x28 |
             (long)(int)(z._4_4_ << 4 | local_28) << 0x20 | local_38;
  for (Cof1 = 0; Cof1 < 2; Cof1 = Cof1 + 1) {
    local_38 = (long)Var2Pla_local[Cof1] << ((char)(Cof1 << 2) + 0x30U & 0x3f) | local_38;
  }
  if (Cof1 + 1 == 3) {
    return 7L << ((char)(Cof1 << 2) + 0x30U & 0x3f) | local_38;
  }
  Cof1 = Cof1 + 1;
  __assert_fail("i == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                ,0x151,"word If_Dec6DeriveDisjoint(word, int *, int *)");
}

Assistant:

static word If_Dec6DeriveDisjoint( word t, int Pla2Var[6], int Var2Pla[6] )
{
	int i, Cof0, Cof1;
    word z = If_Dec6DeriveCount2( t, &Cof0, &Cof1 );
	for ( i = 0; i < 4; i++ )
		z |= (((word)Pla2Var[i+2]) << (16 + 4*i));
	z |= ((word)((Cof1 << 4) | Cof0) << 32);
	z |= ((word)((Cof1 << 4) | Cof0) << 40);
	for ( i = 0; i < 2; i++ )
		z |= (((word)Pla2Var[i]) << (48 + 4*i));
    z |= (((word)7) << (48 + 4*i++));
    assert( i == 3 );
    return z;
}